

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O3

void apply_z(tc_uECC_word_t *X1,tc_uECC_word_t *Y1,tc_uECC_word_t *Z,tc_uECC_Curve curve)

{
  tc_uECC_word_t *result;
  tc_uECC_word_t local_98 [2];
  tc_uECC_word_t t1 [8];
  tc_uECC_word_t product [16];
  
  result = t1 + 6;
  tc_uECC_vli_mult(result,Z,Z,curve->num_words);
  (*curve->mmod_fast)(local_98,result);
  tc_uECC_vli_mult(result,X1,local_98,curve->num_words);
  (*curve->mmod_fast)(X1,result);
  tc_uECC_vli_mult(result,local_98,Z,curve->num_words);
  (*curve->mmod_fast)(local_98,result);
  tc_uECC_vli_mult(result,Y1,local_98,curve->num_words);
  (*curve->mmod_fast)(Y1,result);
  return;
}

Assistant:

void apply_z(tc_uECC_word_t * X1, tc_uECC_word_t * Y1, const tc_uECC_word_t * const Z,
	     tc_uECC_Curve curve)
{
	tc_uECC_word_t t1[NUM_ECC_WORDS];

	tc_uECC_vli_modSquare_fast(t1, Z, curve);    /* z^2 */
	tc_uECC_vli_modMult_fast(X1, X1, t1, curve); /* x1 * z^2 */
	tc_uECC_vli_modMult_fast(t1, t1, Z, curve);  /* z^3 */
	tc_uECC_vli_modMult_fast(Y1, Y1, t1, curve); /* y1 * z^3 */
}